

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::parser<char>::printOptionDiff
          (parser<char> *this,Option *O,char V,OptionValue<char> *D,size_t GlobalWidth)

{
  bool bVar1;
  int iVar2;
  raw_ostream *prVar3;
  ulong uVar4;
  char *pcVar5;
  uint local_98;
  size_t NumSpaces;
  raw_string_ostream SS;
  string Str;
  size_t GlobalWidth_local;
  OptionValue<char> *D_local;
  char V_local;
  Option *O_local;
  parser<char> *this_local;
  
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  std::__cxx11::string::string((string *)&SS.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)&NumSpaces,(string *)&SS.OS);
  raw_ostream::operator<<((raw_ostream *)&NumSpaces,V);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)&NumSpaces);
  prVar3 = outs();
  prVar3 = raw_ostream::operator<<(prVar3,"= ");
  raw_ostream::operator<<(prVar3,(string *)&SS.OS);
  uVar4 = std::__cxx11::string::size();
  if (uVar4 < 8) {
    iVar2 = std::__cxx11::string::size();
    local_98 = 8 - iVar2;
  }
  else {
    local_98 = 0;
  }
  prVar3 = outs();
  prVar3 = raw_ostream::indent(prVar3,local_98);
  raw_ostream::operator<<(prVar3," (default: ");
  bVar1 = OptionValueCopy<char>::hasValue((OptionValueCopy<char> *)D);
  if (bVar1) {
    prVar3 = outs();
    pcVar5 = OptionValueCopy<char>::getValue((OptionValueCopy<char> *)D);
    raw_ostream::operator<<(prVar3,*pcVar5);
  }
  else {
    prVar3 = outs();
    raw_ostream::operator<<(prVar3,"*no default*");
  }
  prVar3 = outs();
  raw_ostream::operator<<(prVar3,")\n");
  std::__cxx11::string::~string((string *)&SS.OS);
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}